

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O2

void __thiscall UKF::~UKF(UKF *this)

{
  this->_vptr_UKF = (_func_int **)&PTR__UKF_00126d48;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->weights_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->Xsig_pred_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->P_);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&this->x_);
  return;
}

Assistant:

UKF::~UKF() {}